

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator::
RepeatedImmutableMessageFieldLiteGenerator
          (RepeatedImmutableMessageFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,Context *context)

{
  ClassNameResolver *pCVar1;
  FieldGeneratorInfo *info;
  Context *context_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  RepeatedImmutableMessageFieldLiteGenerator *this_local;
  
  ImmutableFieldLiteGenerator::ImmutableFieldLiteGenerator(&this->super_ImmutableFieldLiteGenerator)
  ;
  (this->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__RepeatedImmutableMessageFieldLiteGenerator_008e8440;
  this->descriptor_ = descriptor;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  anon_unknown_5::SetMessageVariables
            (descriptor,messageBitIndex,0,info,this->name_resolver_,&this->variables_);
  return;
}

Assistant:

RepeatedImmutableMessageFieldLiteGenerator::
    RepeatedImmutableMessageFieldLiteGenerator(
        const FieldDescriptor* descriptor, int messageBitIndex,
        Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, 0,
                      context->GetFieldGeneratorInfo(descriptor),
                      name_resolver_, &variables_);
}